

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

BVIndex __thiscall BVStatic<65536UL>::Count(BVStatic<65536UL> *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  uint uVar5;
  long lVar6;
  undefined8 *in_FS_OFFSET;
  
  uVar5 = 0;
  for (lVar6 = 0; lVar6 != 0x2000; lVar6 = lVar6 + 8) {
    BVar4 = BVUnitT<unsigned_long>::Count
                      ((BVUnitT<unsigned_long> *)((long)&this->data[0].word + lVar6));
    uVar5 = uVar5 + BVar4;
  }
  if (0x10000 < uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x1f6,"(sum <= bitCount)","sum <= bitCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return uVar5;
}

Assistant:

BVIndex Count() const
    {
        BVIndex sum = 0;
        for (BVIndex i = 0; i < wordCount; i++)
        {
            sum += this->data[i].Count();
        }

        Assert(sum <= bitCount);
        return sum;
    }